

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<int,3ul>>(Attribute *this,array<int,_3UL> *v)

{
  value_type *pvVar1;
  optional<std::array<int,_3UL>_> local_40;
  undefined1 local_30 [8];
  optional<std::array<int,_3UL>_> ret;
  array<int,_3UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<int,_3UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._4_8_ = v;
    primvar::PrimVar::get_value<std::array<int,3ul>>(&local_40,&this->_var);
    nonstd::optional_lite::optional<std::array<int,_3UL>_>::optional<std::array<int,_3UL>,_0>
              ((optional<std::array<int,_3UL>_> *)local_30,&local_40);
    nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional(&local_40);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_30);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<int,_3UL>_>::value
                         ((optional<std::array<int,_3UL>_> *)local_30);
      *(undefined8 *)ret.contained._4_8_ = *(undefined8 *)pvVar1->_M_elems;
      *(int *)(ret.contained._4_8_ + 8) = pvVar1->_M_elems[2];
    }
    nonstd::optional_lite::optional<std::array<int,_3UL>_>::~optional
              ((optional<std::array<int,_3UL>_> *)local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }